

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O2

faidx_t * fai_load(char *fn)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *__s;
  char *pcVar4;
  char *__filename;
  FILE *pFVar5;
  hFILE *fp;
  void *__dest;
  ssize_t sVar6;
  faidx_t *fai;
  BGZF *fp_00;
  ulong uVar7;
  
  sVar3 = strlen(fn);
  __s = (char *)calloc(sVar3 + 5,1);
  sprintf(__s,"%s.fai",fn);
  iVar1 = hisremote(__s);
  if (iVar1 == 0) {
    pFVar5 = fopen(__s,"rb");
    if (pFVar5 == (FILE *)0x0) {
      fwrite("[fai_load] build FASTA index.\n",0x1e,1,_stderr);
      fai_build(fn);
      pFVar5 = fopen(__s,"rb");
      if (pFVar5 == (FILE *)0x0) {
        fwrite("[fai_load] fail to open FASTA index.\n",0x25,1,_stderr);
        free(__s);
        return (faidx_t *)0x0;
      }
    }
  }
  else {
    sVar3 = strlen(__s);
    pcVar4 = __s + (int)sVar3;
    do {
      __filename = pcVar4;
      pcVar4 = __filename + -1;
      if (pcVar4 < __s) break;
    } while (*pcVar4 != '/');
    pFVar5 = fopen(__filename,"r");
    if (pFVar5 == (FILE *)0x0) {
      fp = hopen(__s,"rb");
      if (fp == (hFILE *)0x0) {
        fprintf(_stderr,"[download_from_remote] fail to open remote file %s\n",__s);
      }
      else {
        pFVar5 = fopen(__filename,"wb");
        if (pFVar5 != (FILE *)0x0) {
          __dest = calloc(0x100000,1);
          do {
            pcVar4 = fp->begin;
            uVar7 = (long)fp->end - (long)pcVar4;
            sVar3 = 0x100000;
            if (uVar7 < 0x100000) {
              sVar3 = uVar7;
            }
            memcpy(__dest,pcVar4,sVar3);
            fp->begin = pcVar4 + sVar3;
            uVar2 = 0x100000;
            if (uVar7 < 0x100000) {
              sVar6 = hread2(fp,__dest,0x100000,sVar3);
              uVar2 = (uint)sVar6;
              if ((int)uVar2 < 1) goto LAB_0012b590;
            }
            fwrite(__dest,1,(ulong)(uVar2 & 0x7fffffff),pFVar5);
          } while( true );
        }
        fprintf(_stderr,"[download_from_remote] fail to create file in the working directory %s\n",
                __filename);
        hclose_abruptly(fp);
      }
      goto LAB_0012b6c7;
    }
  }
  goto LAB_0012b5d3;
LAB_0012b590:
  free(__dest);
  fclose(pFVar5);
  iVar1 = hclose(fp);
  if (iVar1 != 0) {
    fprintf(_stderr,"[download_from_remote] fail to close remote file %s\n",__s);
  }
  pFVar5 = fopen(__filename,"r");
  if (pFVar5 == (FILE *)0x0) {
LAB_0012b6c7:
    fprintf(_stderr,"[fai_load] failed to open remote FASTA index %s\n",__s);
    free(__s);
    return (faidx_t *)0x0;
  }
LAB_0012b5d3:
  fai = fai_read((FILE *)pFVar5);
  fclose(pFVar5);
  fp_00 = bgzf_open(fn,"rb");
  fai->bgzf = fp_00;
  free(__s);
  if (fp_00 == (BGZF *)0x0) {
    fwrite("[fai_load] fail to open FASTA file.\n",0x24,1,_stderr);
  }
  else {
    if (((undefined1  [96])*fp_00 & (undefined1  [96])0x60000000) != (undefined1  [96])0x20000000) {
      return fai;
    }
    iVar1 = bgzf_index_load(fp_00,fn,".gzi");
    if (-1 < iVar1) {
      return fai;
    }
    fprintf(_stderr,"[fai_load] failed to load .gzi index: %s[.gzi]\n",fn);
    fai_destroy(fai);
  }
  return (faidx_t *)0x0;
}

Assistant:

faidx_t *fai_load(const char *fn)
{
    char *str;
    FILE *fp;
    faidx_t *fai;
    str = (char*)calloc(strlen(fn) + 5, 1);
    sprintf(str, "%s.fai", fn);

    if (hisremote(str))
    {
        fp = download_and_open(str);
        if ( !fp )
        {
            fprintf(stderr, "[fai_load] failed to open remote FASTA index %s\n", str);
            free(str);
            return 0;
        }
    }
    else
        fp = fopen(str, "rb");

    if (fp == 0) {
        fprintf(stderr, "[fai_load] build FASTA index.\n");
        fai_build(fn);
        fp = fopen(str, "rb");
        if (fp == 0) {
            fprintf(stderr, "[fai_load] fail to open FASTA index.\n");
            free(str);
            return 0;
        }
    }

    fai = fai_read(fp);
    fclose(fp);

    fai->bgzf = bgzf_open(fn, "rb");
    free(str);
    if (fai->bgzf == 0) {
        fprintf(stderr, "[fai_load] fail to open FASTA file.\n");
        return 0;
    }
    if ( fai->bgzf->is_compressed==1 )
    {
        if ( bgzf_index_load(fai->bgzf, fn, ".gzi") < 0 )
        {
            fprintf(stderr, "[fai_load] failed to load .gzi index: %s[.gzi]\n", fn);
            fai_destroy(fai);
            return NULL;
        }
    }
    return fai;
}